

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_uint_vector.h
# Opt level: O1

void __thiscall
s2coding::EncodeUintVector<unsigned_int>(s2coding *this,Span<const_unsigned_int> v,Encoder *encoder)

{
  uint uVar1;
  uchar *puVar2;
  Encoder *this_00;
  long lVar3;
  pointer puVar4;
  uint uVar5;
  
  this_00 = (Encoder *)v.len_;
  puVar4 = v.ptr_;
  if (puVar4 == (pointer)0x0) {
    uVar1 = 1;
  }
  else {
    uVar1 = 1;
    lVar3 = 0;
    do {
      uVar1 = uVar1 | *(uint *)(this + lVar3);
      lVar3 = lVar3 + 4;
    } while ((long)puVar4 * 4 - lVar3 != 0);
  }
  uVar5 = 0x1f;
  if (uVar1 != 0) {
    for (; uVar1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  uVar5 = (uVar5 ^ 0x18) >> 3;
  uVar1 = 4 - uVar5;
  Encoder::Ensure(this_00,(ulong)uVar1 * (long)puVar4 + 10);
  puVar2 = (uchar *)Varint::Encode64((char *)this_00->buf_,(long)puVar4 * 4 + (ulong)(uVar5 ^ 3));
  this_00->buf_ = puVar2;
  if (puVar4 != (pointer)0x0) {
    lVar3 = 0;
    do {
      EncodeUintWithLength<unsigned_int>(*(uint *)(this + lVar3),uVar1,this_00);
      lVar3 = lVar3 + 4;
    } while ((long)puVar4 << 2 != lVar3);
  }
  return;
}

Assistant:

void EncodeUintVector(absl::Span<const T> v, Encoder* encoder) {
  // The encoding is as follows:
  //
  //   varint64: (v.size() * sizeof(T)) | (len - 1)
  //   array of v.size() elements ["len" bytes each]
  //
  // Note that we don't allow (len == 0) since this would require an extra bit
  // to encode the length.

  T one_bits = 1;  // Ensures len >= 1.
  for (auto x : v) one_bits |= x;
  int len = (Bits::FindMSBSetNonZero64(one_bits) >> 3) + 1;
  S2_DCHECK(len >= 1 && len <= 8);

  // Note that the multiplication is optimized into a bit shift.
  encoder->Ensure(Varint::kMax64 + v.size() * len);
  uint64 size_len = (uint64{v.size()} * sizeof(T)) | (len - 1);
  encoder->put_varint64(size_len);
  for (auto x : v) {
    EncodeUintWithLength(x, len, encoder);
  }
}